

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

NativePixmapFactory *
eglu::selectNativePixmapFactory(NativeDisplayFactory *factory,CommandLine *cmdLine)

{
  NativePixmapFactoryRegistry *registry;
  char *cmdLineArg;
  NativePixmapFactory *pNVar1;
  CommandLine *cmdLine_local;
  NativeDisplayFactory *factory_local;
  
  registry = NativeDisplayFactory::getNativePixmapRegistry(factory);
  cmdLineArg = tcu::CommandLine::getEGLPixmapType(cmdLine);
  pNVar1 = selectFactory<eglu::NativePixmapFactory>(registry,"pixmap",cmdLineArg);
  return pNVar1;
}

Assistant:

const NativePixmapFactory& selectNativePixmapFactory (const NativeDisplayFactory& factory, const tcu::CommandLine& cmdLine)
{
	return selectFactory(factory.getNativePixmapRegistry(), "pixmap", cmdLine.getEGLPixmapType());
}